

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.cpp
# Opt level: O1

void __thiscall AppendFile::append(AppendFile *this,char *logline,size_t len)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t __n;
  
  sVar2 = fwrite_unlocked(logline,1,len,(FILE *)this->fp_);
  __n = len - sVar2;
  do {
    if (__n == 0) {
      return;
    }
    sVar3 = fwrite_unlocked(logline + sVar2,1,__n,(FILE *)this->fp_);
    if (sVar3 == 0) {
      iVar1 = ferror((FILE *)this->fp_);
      if (iVar1 != 0) {
        append();
      }
    }
    else {
      sVar2 = sVar2 + sVar3;
      __n = len - sVar2;
    }
  } while (sVar3 != 0);
  return;
}

Assistant:

void AppendFile::append(const char *logline, const size_t len){
    size_t n = this->write(logline, len);
    size_t remain = len -n;
    while (remain>0) {
        size_t x = this->write(logline+n, remain);
        if(x==0){
            int err = ferror(fp_);  // 检查文件流是否出错，若错返回0，否则非0. 
            if(err) fprintf(stderr, "AppendFile::append() failed !\n");
            break;
        }
        n+=x;
        remain = len -n;
    }
}